

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

inner_node * __thiscall
stx::
btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
::allocate_inner(btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
                 *this,unsigned_short level)

{
  inner_node *__s;
  btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
  *in_RDI;
  inner_node *n;
  inner_node *this_00;
  size_type in_stack_ffffffffffffffc8;
  new_allocator<stx::btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>::inner_node>
  *in_stack_ffffffffffffffd0;
  undefined1 local_19 [25];
  
  this_00 = (inner_node *)local_19;
  inner_node_allocator(in_RDI);
  __s = __gnu_cxx::
        new_allocator<stx::btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>::inner_node>
        ::allocate(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,this_00);
  memset(__s,0,0x110);
  std::
  allocator<stx::btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>::inner_node>
  ::~allocator((allocator<stx::btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>::inner_node>
                *)0x112f5e);
  local_19._1_8_ = __s;
  inner_node::initialize(this_00,(unsigned_short)((ulong)in_RDI >> 0x30));
  (in_RDI->m_stats).innernodes = (in_RDI->m_stats).innernodes + 1;
  return (inner_node *)local_19._1_8_;
}

Assistant:

inline inner_node* allocate_inner(unsigned short level)
        {
            inner_node *n = new (inner_node_allocator().allocate(1)) inner_node();
            n->initialize(level);
            m_stats.innernodes++;
            return n;
        }